

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall Js::ByteCodeWriter::ShouldIncrementCallSiteId(ByteCodeWriter *this,OpCode op)

{
  bool bVar1;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  bVar1 = DoProfileCallOp(op);
  if ((((bVar1) && (bVar1 = DoDynamicProfileOpcode(this,InlinePhase,false), bVar1)) ||
      ((bVar1 = DoProfileNewScObjArrayOp(this,op), bVar1 &&
       ((bVar1 = DoDynamicProfileOpcode(this,NativeArrayPhase,true), bVar1 ||
        (bVar1 = DoDynamicProfileOpcode(this,InlinePhase,true), bVar1)))))) ||
     ((bVar1 = DoProfileNewScObjectOp(this,op), bVar1 &&
      ((bVar1 = DoDynamicProfileOpcode(this,InlinePhase,true), bVar1 ||
       (bVar1 = DoDynamicProfileOpcode(this,FixedNewObjPhase,true), bVar1)))))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::ShouldIncrementCallSiteId(OpCode op)
    {
        if ((DoProfileCallOp(op) && DoDynamicProfileOpcode(InlinePhase)) ||
            (DoProfileNewScObjArrayOp(op) && (DoDynamicProfileOpcode(NativeArrayPhase, true) || DoDynamicProfileOpcode(InlinePhase, true))) ||
            (DoProfileNewScObjectOp(op) && (DoDynamicProfileOpcode(InlinePhase, true) || DoDynamicProfileOpcode(FixedNewObjPhase, true))))
        {
            return true;
        }
        return false;
    }